

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O2

void process_statement_list(CompilerState *compiler_state,AstNodeList *list)

{
  AstNodeList **ppAVar1;
  anon_union_72_25_595a31af_for_AstNode_2 *list_00;
  byte *pbVar2;
  LuaSymbolList **list_01;
  AstNodeList **list_02;
  AstNodeList *pAVar3;
  LuaSymbolList *pLVar4;
  AstNodeList *pAVar5;
  AstNodeList *pAVar6;
  AstNodeList *pAVar7;
  LuaSymbolList *pLVar8;
  AstNodeType AVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  void *pvVar13;
  AstNode *pAVar14;
  Scope *pSVar15;
  AstNode *pAVar16;
  StringObject *pSVar17;
  LuaSymbol *pLVar18;
  LuaSymbol *sym;
  LuaSymbol *sym_00;
  LuaSymbolList *pLVar19;
  AstNode *pAVar20;
  AstNode *pAVar21;
  AstNode *pAVar22;
  AstNodeList *pAVar23;
  Scope *pSVar24;
  AstNode *pAVar25;
  AstNodeList *pAVar26;
  char s [8];
  char f [8];
  PtrListIterator local_60;
  PtrListIterator nodeiter__;
  
  raviX_ptrlist_forward_iterator(&nodeiter__,(PtrList *)list);
LAB_0010aa47:
switchD_0010aa7b_caseD_0:
  piVar12 = (int *)raviX_ptrlist_iter_next(&nodeiter__);
  if (piVar12 == (int *)0x0) {
    return;
  }
  switch(*piVar12) {
  case 0:
  case 2:
  case 3:
  case 0xe:
    goto switchD_0010aa7b_caseD_0;
  case 1:
    pAVar26 = *(AstNodeList **)(piVar12 + 2);
    goto LAB_0010aa9b;
  case 4:
    pAVar26 = *(AstNodeList **)(piVar12 + 4);
    break;
  case 5:
    goto switchD_0010aa7b_caseD_5;
  case 6:
    pAVar25 = *(AstNode **)(piVar12 + 8);
    goto LAB_0010ab3f;
  case 7:
    raviX_ptrlist_forward_iterator(&local_60,*(PtrList **)(piVar12 + 2));
    while (pvVar13 = raviX_ptrlist_iter_next(&local_60), pvVar13 != (void *)0x0) {
      process_expression(compiler_state,*(AstNode **)((long)pvVar13 + 8));
      process_statement_list(compiler_state,*(AstNodeList **)((long)pvVar13 + 0x18));
    }
    if (*(long *)(piVar12 + 4) != 0) goto LAB_0010ab14;
    goto switchD_0010aa7b_caseD_0;
  default:
    fprintf(_stderr,"AST = %d\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_lower.c"
                  ,0x197,"void process_statement(CompilerState *, AstNode *)");
  case 9:
    process_expression(compiler_state,*(AstNode **)(piVar12 + 2));
LAB_0010ab14:
    pAVar26 = *(AstNodeList **)(piVar12 + 6);
    break;
  case 10:
    goto switchD_0010aa7b_caseD_a;
  case 0xb:
    process_expression_list(compiler_state,*(AstNodeList **)(piVar12 + 6));
    pAVar26 = *(AstNodeList **)(piVar12 + 10);
    break;
  case 0xc:
    process_statement_list(compiler_state,*(AstNodeList **)(piVar12 + 6));
    pAVar25 = *(AstNode **)(piVar12 + 2);
LAB_0010ab3f:
    process_expression(compiler_state,pAVar25);
    goto switchD_0010aa7b_caseD_0;
  case 0xd:
    if (*(AstNodeList **)(piVar12 + 2) != (AstNodeList *)0x0) {
      process_expression_list(compiler_state,*(AstNodeList **)(piVar12 + 2));
    }
    goto switchD_0010aa7b_caseD_5;
  }
  process_statement_list(compiler_state,pAVar26);
  goto switchD_0010aa7b_caseD_0;
switchD_0010aa7b_caseD_a:
  pSVar24 = *(Scope **)(piVar12 + 2);
  pAVar25 = pSVar24->function;
  pAVar26 = *(AstNodeList **)(piVar12 + 8);
  pAVar14 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,piVar12[1]);
  (pAVar14->field_2).goto_stmt.name = (StringObject *)0x0;
  ppAVar1 = &(pAVar14->field_2).local_stmt.expr_list;
  pSVar15 = raviX_allocate_scope(compiler_state,pAVar25,pSVar24->parent);
  (pAVar14->field_2).do_stmt.scope = pSVar15;
  local_60.__list._0_2_ = 0x29;
  builtin_strncpy(f,"(for_f)",8);
  builtin_strncpy(s,"(for_s)",8);
  local_60.__head = (PtrList *)0x7261765f726f6628;
  pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,piVar12[1]);
  (pAVar16->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  list_00 = &pAVar16->field_2;
  (pAVar16->field_2).goto_stmt.name = *(StringObject **)(piVar12 + 6);
  pSVar17 = raviX_create_string(compiler_state,f,7);
  pLVar18 = raviX_new_local_symbol(compiler_state,pSVar15,pSVar17,RAVI_TANY,(StringObject *)0x0);
  pSVar17 = raviX_create_string(compiler_state,s,7);
  sym = raviX_new_local_symbol(compiler_state,pSVar15,pSVar17,RAVI_TANY,(StringObject *)0x0);
  pSVar17 = raviX_create_string(compiler_state,(char *)&local_60,9);
  sym_00 = raviX_new_local_symbol(compiler_state,pSVar15,pSVar17,RAVI_TANY,(StringObject *)0x0);
  pbVar2 = (byte *)((long)&pLVar18->field_1 + 0x28);
  *pbVar2 = *pbVar2 | 4;
  pbVar2 = (byte *)((long)&sym->field_1 + 0x28);
  *pbVar2 = *pbVar2 | 4;
  pbVar2 = (byte *)((long)&sym_00->field_1 + 0x28);
  *pbVar2 = *pbVar2 | 4;
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&list_00->return_stmt,pLVar18);
  list_01 = &pSVar15->symbol_list;
  raviX_add_symbol(compiler_state,list_01,pLVar18);
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&list_00->return_stmt,sym);
  raviX_add_symbol(compiler_state,list_01,sym);
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&list_00->return_stmt,sym_00);
  raviX_add_symbol(compiler_state,list_01,sym_00);
  add_ast_node(compiler_state,ppAVar1,pAVar16);
  pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,STMT_WHILE,piVar12[1]);
  list_02 = &(pAVar16->field_2).test_then_block.test_then_statement_list;
  pSVar24->parent = pSVar15;
  (pAVar16->field_2).test_then_block.test_then_scope = pSVar24;
  (pAVar16->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pLVar19 = (LuaSymbolList *)allocate_expr_ast_node(compiler_state,EXPR_LITERAL);
  *(undefined4 *)&pLVar19->prev_ = 7;
  pLVar19->next_ = (LuaSymbolList *)0x0;
  pLVar19->list_[0] = (LuaSymbol *)0x1;
  (pAVar16->field_2).local_stmt.var_list = pLVar19;
  add_ast_node(compiler_state,ppAVar1,pAVar16);
  pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,piVar12[1]);
  (pAVar16->field_2).return_stmt.expr_list = *(AstNodeList **)(piVar12 + 4);
  (pAVar16->field_2).goto_stmt.name = (StringObject *)0x0;
  iVar11 = raviX_ptrlist_size(*(PtrList **)(piVar12 + 4));
  pAVar20 = allocate_expr_ast_node(compiler_state,EXPR_SUFFIXED);
  pAVar21 = make_symbol_expr(compiler_state,pLVar18);
  (pAVar20->field_2).function_stmt.function_expr = pAVar21;
  (pAVar20->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar20->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar20->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  pAVar21 = allocate_expr_ast_node(compiler_state,EXPR_FUNCTION_CALL);
  ppAVar1 = &(pAVar21->field_2).for_stmt.for_statement_list;
  (pAVar21->field_2).function_stmt.function_expr = (AstNode *)0x0;
  (pAVar21->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  (pAVar21->field_2).function_call_expr.num_results = iVar11;
  (pAVar21->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar21->field_2).goto_stmt.name = (StringObject *)0x0;
  pAVar22 = make_symbol_expr(compiler_state,sym);
  add_ast_node(compiler_state,ppAVar1,pAVar22);
  pAVar22 = make_symbol_expr(compiler_state,sym_00);
  add_ast_node(compiler_state,ppAVar1,pAVar22);
  add_ast_node(compiler_state,&(pAVar20->field_2).for_stmt.for_statement_list,pAVar21);
  add_ast_node(compiler_state,&(pAVar16->field_2).local_stmt.expr_list,pAVar20);
  add_ast_node(compiler_state,list_02,pAVar16);
  pLVar18 = (LuaSymbol *)raviX_ptrlist_first(*(PtrList **)(piVar12 + 4));
  pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,STMT_IF,piVar12[1]);
  (pAVar16->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  (pAVar16->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  (pAVar16->field_2).goto_stmt.name = (StringObject *)0x0;
  pAVar20 = raviX_allocate_ast_node_at_line(compiler_state,STMT_TEST_THEN,piVar12[1]);
  pAVar23 = (AstNodeList *)allocate_expr_ast_node(compiler_state,EXPR_BINARY);
  pAVar21 = make_symbol_expr(compiler_state,pLVar18);
  pAVar23->list_[0] = pAVar21;
  pAVar21 = allocate_expr_ast_node(compiler_state,EXPR_LITERAL);
  (pAVar21->field_2).common_expr.type.type_code = RAVI_TNIL;
  (pAVar21->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar21->field_2).function_stmt.function_expr = (AstNode *)0x0;
  pAVar23->list_[1] = pAVar21;
  *(undefined4 *)((long)&pAVar23->allocator_ + 4) = 0xd;
  (pAVar20->field_2).expression_stmt.var_expr_list = pAVar23;
  (pAVar20->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar20->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pSVar24 = raviX_allocate_scope(compiler_state,pAVar25,pSVar24);
  (pAVar20->field_2).test_then_block.test_then_scope = pSVar24;
  pSVar17 = raviX_create_string(compiler_state,"break",6);
  pAVar25 = raviX_allocate_ast_node_at_line(compiler_state,STMT_GOTO,0);
  (pAVar25->field_2).goto_stmt.name = pSVar17;
  *(byte *)&pAVar25->field_2 = *(byte *)&pAVar25->field_2 | 1;
  (pAVar25->field_2).goto_stmt.goto_scope = pSVar24;
  add_ast_node(compiler_state,&(pAVar20->field_2).test_then_block.test_then_statement_list,pAVar25);
  add_ast_node(compiler_state,&(pAVar16->field_2).return_stmt.expr_list,pAVar20);
  add_ast_node(compiler_state,list_02,pAVar16);
  pAVar25 = raviX_allocate_ast_node_at_line(compiler_state,STMT_EXPR,piVar12[1]);
  (pAVar25->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  (pAVar25->field_2).goto_stmt.name = (StringObject *)0x0;
  pAVar16 = make_symbol_expr(compiler_state,sym_00);
  add_ast_node(compiler_state,&(pAVar25->field_2).return_stmt.expr_list,pAVar16);
  pLVar18 = (LuaSymbol *)raviX_ptrlist_first(*(PtrList **)(piVar12 + 4));
  pAVar16 = make_symbol_expr(compiler_state,pLVar18);
  add_ast_node(compiler_state,&(pAVar25->field_2).local_stmt.expr_list,pAVar16);
  add_ast_node(compiler_state,list_02,pAVar25);
  pAVar25 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,piVar12[1]);
  (pAVar25->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar25->field_2).return_stmt.expr_list = pAVar26;
  add_ast_node(compiler_state,list_02,pAVar25);
  (pAVar25->field_2).goto_stmt.name = *(StringObject **)(piVar12 + 10);
  piVar12[2] = 0;
  piVar12[3] = 0;
  piVar12[8] = 0;
  piVar12[9] = 0;
  piVar12[10] = 0;
  piVar12[0xb] = 0;
  AVar9 = pAVar14->type;
  uVar10 = pAVar14->line_number;
  pAVar5 = (pAVar14->field_2).return_stmt.expr_list;
  pSVar17 = (pAVar14->field_2).goto_stmt.name;
  pSVar15 = (pAVar14->field_2).goto_stmt.goto_scope;
  pAVar16 = (pAVar14->field_2).function_stmt.function_expr;
  pAVar6 = (pAVar14->field_2).for_stmt.for_statement_list;
  pAVar7 = (pAVar14->field_2).function_expr.function_statement_list;
  pLVar8 = (pAVar14->field_2).function_expr.args;
  pSVar24 = (pAVar14->field_2).goto_stmt.goto_scope;
  pAVar25 = (pAVar14->field_2).function_stmt.function_expr;
  pAVar26 = (pAVar14->field_2).for_stmt.for_statement_list;
  pAVar23 = (pAVar14->field_2).function_expr.function_statement_list;
  pLVar19 = (pAVar14->field_2).function_expr.args;
  pAVar3 = (pAVar14->field_2).function_expr.child_functions;
  pLVar4 = (pAVar14->field_2).function_expr.upvalues;
  *(StringObject **)(piVar12 + 4) = (pAVar14->field_2).goto_stmt.name;
  *(Scope **)(piVar12 + 6) = pSVar24;
  *(AstNode **)(piVar12 + 8) = pAVar25;
  *(AstNodeList **)(piVar12 + 10) = pAVar26;
  *(AstNodeList **)(piVar12 + 0xc) = pAVar23;
  *(LuaSymbolList **)(piVar12 + 0xe) = pLVar19;
  *(AstNodeList **)(piVar12 + 0x10) = pAVar3;
  *(LuaSymbolList **)(piVar12 + 0x12) = pLVar4;
  piVar12[0] = AVar9;
  piVar12[1] = uVar10;
  *(AstNodeList **)(piVar12 + 2) = pAVar5;
  *(StringObject **)(piVar12 + 4) = pSVar17;
  *(Scope **)(piVar12 + 6) = pSVar15;
  *(AstNode **)(piVar12 + 8) = pAVar16;
  *(AstNodeList **)(piVar12 + 10) = pAVar6;
  *(AstNodeList **)(piVar12 + 0xc) = pAVar7;
  *(LuaSymbolList **)(piVar12 + 0xe) = pLVar8;
  if (*piVar12 != 4) {
    __assert_fail("node->type == STMT_DO",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_lower.c"
                  ,400,"void process_statement(CompilerState *, AstNode *)");
  }
  process_statement_list(compiler_state,*(AstNodeList **)(piVar12 + 4));
  goto LAB_0010aa47;
switchD_0010aa7b_caseD_5:
  pAVar26 = *(AstNodeList **)(piVar12 + 4);
LAB_0010aa9b:
  process_expression_list(compiler_state,pAVar26);
  goto switchD_0010aa7b_caseD_0;
}

Assistant:

static void process_statement_list(CompilerState *compiler_state, AstNodeList *list)
{
	AstNode *node;
	FOR_EACH_PTR(list, AstNode, node) { process_statement(compiler_state, node); }
	END_FOR_EACH_PTR(node);
}